

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int EmitRescaledAlphaRGB(VP8Io *io,WebPDecParams *p,int expected_num_out_lines)

{
  WebPRescaler *rescaler;
  int iVar1;
  int iVar2;
  
  if (io->a != (uint8_t *)0x0) {
    rescaler = p->scaler_a;
    iVar2 = p->last_y + expected_num_out_lines;
    for (; 0 < expected_num_out_lines; expected_num_out_lines = expected_num_out_lines - iVar1) {
      iVar1 = rescaler->src_y;
      WebPRescalerImport(rescaler,(io->mb_y - iVar1) + io->mb_h,
                         io->a + ((long)iVar1 - (long)io->mb_y) * (long)io->width,io->width);
      iVar1 = (*p->emit_alpha_row)(p,iVar2 - expected_num_out_lines,expected_num_out_lines);
    }
  }
  return 0;
}

Assistant:

static int EmitRescaledAlphaRGB(const VP8Io* const io, WebPDecParams* const p,
                                int expected_num_out_lines) {
  if (io->a != NULL) {
    WebPRescaler* const scaler = p->scaler_a;
    int lines_left = expected_num_out_lines;
    const int y_end = p->last_y + lines_left;
    while (lines_left > 0) {
      const int64_t row_offset = (int64_t)scaler->src_y - io->mb_y;
      WebPRescalerImport(scaler, io->mb_h + io->mb_y - scaler->src_y,
                         io->a + row_offset * io->width, io->width);
      lines_left -= p->emit_alpha_row(p, y_end - lines_left, lines_left);
    }
  }
  return 0;
}